

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo_p.h
# Opt level: O2

void __thiscall QFileInfoPrivate::clear(QFileInfoPrivate *this)

{
  int i;
  uint uVar1;
  
  (this->metaData).knownFlagsMask.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = 0;
  clearFlags(this);
  for (uVar1 = 10; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    QString::clear(this->fileNames + uVar1);
  }
  QString::clear(this->fileOwners + 1);
  QString::clear(this->fileOwners);
  return;
}

Assistant:

inline void clear() {
        metaData.clear();
        clearFlags();
        for (int i = QAbstractFileEngine::NFileNames - 1 ; i >= 0 ; --i)
            fileNames[i].clear();
        fileOwners[1].clear();
        fileOwners[0].clear();
    }